

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
VFS::CVFS::Serialize(vector<char,_std::allocator<char>_> *__return_storage_ptr__,CVFS *this)

{
  pointer *this_00;
  int iVar1;
  bool bVar2;
  CVFSFile *this_01;
  element_type *peVar3;
  char *Data;
  size_t sVar4;
  element_type *peVar5;
  size_type sVar6;
  element_type *peVar7;
  long lVar8;
  reference psVar9;
  element_type *Node;
  reference Buf;
  element_type *this_02;
  bad_alloc *e;
  undefined1 local_c0 [8];
  shared_ptr<VFS::CVFSNode> e_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *__range2
  ;
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> Childs;
  size_type local_68;
  uint64_t Entries;
  string local_58;
  undefined1 local_28 [8];
  VFSFile Disk;
  CVFS *this_local;
  vector<char,_std::allocator<char>_> *Ret;
  
  Disk.super___shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_01 = (CVFSFile *)operator_new(0x90);
  Entries._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"stream",(allocator<char> *)((long)&Entries + 7));
  CVFSFile::CVFSFile(this_01,&local_58);
  Entries._6_1_ = 0;
  std::shared_ptr<VFS::CVFS::CVFSFile>::shared_ptr<VFS::CVFS::CVFSFile,void>
            ((shared_ptr<VFS::CVFS::CVFSFile> *)local_28,this_01);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Entries + 7));
  peVar3 = std::__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  CVFSFile::Clear(peVar3);
  peVar3 = std::__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  Data = (char *)std::__cxx11::string::data();
  sVar4 = std::__cxx11::string::size();
  CVFSFile::Write(peVar3,Data,sVar4);
  peVar5 = std::__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_Root);
  CVFSDir::GetChilds((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                      *)&Childs.
                         super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,peVar5);
  this_00 = &Childs.
             super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar6 = std::
          vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
          size((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                *)this_00);
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  ~vector((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           *)this_00);
  local_68 = sVar6;
  peVar3 = std::__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  CVFSFile::Write(peVar3,(char *)&local_68,8);
  peVar7 = std::__shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  iVar1 = this->DISK_CHUNK_SIZE;
  lVar8 = std::__cxx11::string::size();
  FillSpace(this,peVar7,(iVar1 - lVar8) - 8);
  peVar5 = std::__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_Root);
  CVFSDir::GetChilds((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                      *)&__range2,peVar5);
  __end2 = std::
           vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           ::begin((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                    *)&__range2);
  e_1.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
       ::end((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
              *)&__range2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
                                     *)&e_1.
                                        super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar2) {
    psVar9 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
             ::operator*(&__end2);
    std::shared_ptr<VFS::CVFSNode>::shared_ptr((shared_ptr<VFS::CVFSNode> *)local_c0,psVar9);
    peVar7 = std::__shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2> *)local_28);
    Node = std::__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
    SerializeNode(this,peVar7,Node);
    std::shared_ptr<VFS::CVFSNode>::~shared_ptr((shared_ptr<VFS::CVFSNode> *)local_c0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
    ::operator++(&__end2);
  }
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__);
  peVar3 = std::__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  sVar4 = CVFSFile::Size(peVar3);
  std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,sVar4);
  peVar3 = std::__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  Buf = std::vector<char,_std::allocator<char>_>::operator[](__return_storage_ptr__,0);
  this_02 = std::__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<VFS::CVFS::CVFSFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
  sVar4 = CVFSFile::Size(this_02);
  CVFSFile::Read(peVar3,Buf,sVar4,0);
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  ~vector((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           *)&__range2);
  std::shared_ptr<VFS::CVFS::CVFSFile>::~shared_ptr((shared_ptr<VFS::CVFS::CVFSFile> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> Serialize()
            {
                try
                {
                    VFSFile Disk = VFSFile(new CVFSFile("stream"));
                    Disk->Clear();
                    Disk->Write(MAGIC.data(), MAGIC.size());

                    uint64_t Entries = m_Root->GetChilds().size();
                    Disk->Write((char*)&Entries, sizeof(Entries));
                    FillSpace(Disk.get(), DISK_CHUNK_SIZE - (MAGIC.size() + sizeof(Entries)));

                    auto Childs = m_Root->GetChilds();
                    for (auto e : Childs)
                        SerializeNode(Disk.get(), e.get());

                    std::vector<char> Ret;
                    Ret.resize(Disk->Size());
                    Disk->Read(&Ret[0], Disk->Size(), 0);
                    return Ret;
                }
                catch(const std::bad_alloc &e)
                {
                    throw CVFSException("Can't create stream. Out of mem. bad_alloc: " + std::string(e.what()), VFSError::OUT_OF_MEM);
                }
            }